

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brent.c
# Opt level: O3

double brent_zero(custom_funcuni *funcuni,double ai,double bi,double tol,double eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar1 = (*funcuni->funcuni)(ai,funcuni->params);
  dVar2 = (*funcuni->funcuni)(bi,funcuni->params);
  dVar11 = dVar1;
  dVar7 = bi;
  dVar13 = ai;
  if (ABS(dVar1) < ABS(dVar2)) {
    dVar11 = dVar2;
    dVar2 = dVar1;
    dVar7 = ai;
    dVar13 = bi;
  }
  dVar1 = ABS(dVar7) * (eps + eps) + tol;
  dVar3 = (dVar13 - dVar7) * 0.5;
  if ((dVar1 <= ABS(dVar3)) && ((dVar2 != 0.0 || (NAN(dVar2))))) {
    dVar14 = bi - ai;
    dVar9 = dVar11;
    dVar12 = dVar7;
    dVar15 = dVar14;
    dVar4 = dVar13;
    do {
      dVar6 = dVar2;
      dVar5 = dVar3;
      dVar8 = dVar3;
      if ((dVar1 <= ABS(dVar15)) && (ABS(dVar6) < ABS(dVar9))) {
        dVar2 = dVar6 / dVar9;
        dVar7 = dVar3 + dVar3;
        if ((dVar4 != dVar13) || (NAN(dVar4) || NAN(dVar13))) {
          dVar9 = dVar9 / dVar11;
          dVar10 = dVar6 / dVar11 + -1.0;
          dVar7 = (dVar9 - dVar6 / dVar11) * dVar7 * dVar9 - (dVar12 - dVar4) * dVar10;
          dVar9 = (dVar2 + -1.0) * (dVar9 + -1.0) * dVar10;
        }
        else {
          dVar9 = 1.0 - dVar2;
        }
        dVar2 = dVar2 * dVar7;
        dVar4 = -dVar2;
        dVar7 = dVar2;
        if (dVar2 <= dVar4) {
          dVar7 = dVar4;
        }
        dVar2 = (double)(~-(ulong)(dVar4 < dVar2) & (ulong)dVar9 |
                        (ulong)-dVar9 & -(ulong)(dVar4 < dVar2));
        if ((dVar7 + dVar7 < dVar3 * 3.0 * dVar2 - ABS(dVar1 * dVar2)) &&
           (dVar7 < ABS(dVar15 * 0.5 * dVar2))) {
          dVar5 = dVar7 / dVar2;
          dVar8 = dVar14;
        }
      }
      if (ABS(dVar5) <= dVar1) {
        if (dVar3 <= 0.0) {
          dVar7 = dVar12 - dVar1;
        }
        else {
          dVar7 = dVar1 + dVar12;
        }
      }
      else {
        dVar7 = dVar12 + dVar5;
      }
      dVar2 = (*funcuni->funcuni)(dVar7,funcuni->params);
      if (((0.0 < dVar2) && (0.0 < dVar11)) ||
         ((dVar14 = dVar5, dVar1 = dVar11, dVar15 = dVar8, dVar2 <= 0.0 && (dVar11 <= 0.0)))) {
        dVar14 = dVar7 - dVar12;
        dVar1 = dVar6;
        dVar13 = dVar12;
        dVar15 = dVar14;
      }
      dVar5 = dVar7;
      dVar11 = dVar1;
      dVar4 = dVar12;
      if (ABS(dVar1) < ABS(dVar2)) {
        dVar6 = dVar2;
        dVar5 = dVar13;
        dVar11 = dVar2;
        dVar2 = dVar1;
        dVar13 = dVar7;
        dVar4 = dVar7;
      }
      dVar1 = ABS(dVar5) * (eps + eps) + tol;
      dVar3 = (dVar13 - dVar5) * 0.5;
    } while ((dVar1 <= ABS(dVar3)) &&
            ((dVar9 = dVar6, dVar12 = dVar5, dVar2 != 0.0 || (NAN(dVar2)))));
  }
  return dVar7;
}

Assistant:

double brent_zero(custom_funcuni *funcuni, double ai, double bi, double tol, double eps) {
	double bz;
	double a,b,c,d,e,fa,fb,fc;
	double m,s,etol,fd,p,q,r;
	int iter;
	
	fd = eps;
	
	a = ai;
	b = bi;
	c = a;
	fa = FUNCUNI_EVAL(funcuni,a);
	fb = FUNCUNI_EVAL(funcuni,b);
	fc = fa;
	e = b - a;
	d = e;
	
	if (fabs(fc) < fabs(fb)) {
		a = b;
		b = c;
		c = a;
		fa = fb;
		fb = fc;
		fc = fa;
	}
		
	etol = 2 * fd * fabs(b) + tol;
	m = 0.5 * (c - b);
	
	bz = b;
	iter = 0;
	while (fabs ( m ) >= etol && fb != 0.0) {

		iter++;
		
		if (fabs(e) < etol || fabs(fa) <= fabs(fb)) {
			e = m;
			d = e;
		} else {
			
			s = fb/fa;
			if (a == c) {
				// linear interpolation
				p = 2.0 * m * s;
				q = 1.0 - s;
			} else {
				// inverse quadratic interpolation
				q = fa/fc;
				r = fb/fc;
				p = s * (2 * m * q * (q - r) - (b - a) * (r - 1.0));
				q = (q - 1.0) * (r - 1.0) * (s - 1.0);
			}
			
			if (p > 0.0) {
				q = - q;
			} else {
				p = - p;
			}

			s = e;
			e = d;
			
			if ( 2.0 * p < 3.0 * m * q - fabs( etol * q ) && p < fabs( 0.5 * s * q ) ) {
				d = p /q;
			} else {
				e = m;
				d = e;
			}
			
		}
		a = b;
		fa = fb;
		
		if ( fabs(d) > etol ) {
			b += d;
		} else if ( 0.0 < m ) {
			b += etol;
		} else {
			b -= etol;
		}
		
		fb = FUNCUNI_EVAL(funcuni,b);
		
		bz = b;
		if ( ( 0.0 < fb && 0.0 < fc ) || ( fb <= 0.0 && fc <= 0.0 ) ) {
			c = a;
			fc = fa;
			e = b - a;
			d = e;
		}
      
		// To the end of the loop
		
		if (fabs(fc) < fabs(fb)) {
			a = b;
			b = c;
			c = a;
			fa = fb;
			fb = fc;
			fc = fa;
		}
		
		etol = 2 * fd * fabs(b) + tol;
		m = 0.5 * (c - b);
		
	}
	
	return bz;
}